

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O0

XUtf8FontStruct * XCreateUtf8FontStruct(Display *dpy,char *base_font_name_list)

{
  int iVar1;
  XUtf8FontStruct *font_set;
  char *base_font_name_list_local;
  Display *dpy_local;
  
  dpy_local = (Display *)malloc(0x38);
  if ((XUtf8FontStruct *)dpy_local == (XUtf8FontStruct *)0x0) {
    dpy_local = (Display *)0x0;
  }
  else {
    iVar1 = get_font_list(base_font_name_list,&((XUtf8FontStruct *)dpy_local)->font_name_list);
    ((XUtf8FontStruct *)dpy_local)->nb_font = iVar1;
    if (((XUtf8FontStruct *)dpy_local)->nb_font < 1) {
      free(dpy_local);
      dpy_local = (Display *)0x0;
    }
    else {
      load_fonts(dpy,(XUtf8FontStruct *)dpy_local);
    }
  }
  return (XUtf8FontStruct *)dpy_local;
}

Assistant:

XUtf8FontStruct *
XCreateUtf8FontStruct(Display    *dpy,
		      const char *base_font_name_list) {

  XUtf8FontStruct *font_set;

  font_set = (XUtf8FontStruct*)malloc(sizeof(XUtf8FontStruct));

  if (!font_set) {
    return NULL;
  }

  font_set->nb_font = get_font_list(base_font_name_list,
				    &font_set->font_name_list);

  if (font_set->nb_font < 1) {
    free(font_set);
    return NULL;
  }

  load_fonts(dpy, font_set);

  return font_set;
}